

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateServiceOptions
          (DescriptorBuilder *this,ServiceDescriptor *service,ServiceDescriptorProto *proto)

{
  long lVar1;
  ServiceDescriptorProto *descriptor;
  bool bVar2;
  int iVar3;
  FileDescriptor *pFVar4;
  FileOptions *pFVar5;
  string *element_name;
  MethodDescriptorProto *proto_00;
  int local_58;
  int i;
  allocator<char> local_41;
  string local_40;
  ServiceDescriptorProto *local_20;
  ServiceDescriptorProto *proto_local;
  ServiceDescriptor *service_local;
  DescriptorBuilder *this_local;
  
  local_20 = proto;
  proto_local = (ServiceDescriptorProto *)service;
  service_local = (ServiceDescriptor *)this;
  pFVar4 = ServiceDescriptor::file(service);
  bVar2 = IsLite(pFVar4);
  if (bVar2) {
    pFVar4 = ServiceDescriptor::file((ServiceDescriptor *)proto_local);
    pFVar5 = FileDescriptor::options(pFVar4);
    bVar2 = FileOptions::cc_generic_services(pFVar5);
    if (!bVar2) {
      pFVar4 = ServiceDescriptor::file((ServiceDescriptor *)proto_local);
      pFVar5 = FileDescriptor::options(pFVar4);
      bVar2 = FileOptions::java_generic_services(pFVar5);
      if (!bVar2) goto LAB_002c917b;
    }
    element_name = ServiceDescriptor::full_name_abi_cxx11_((ServiceDescriptor *)proto_local);
    descriptor = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "Files with optimize_for = LITE_RUNTIME cannot define services unless you set both options cc_generic_services and java_generic_sevices to false."
               ,&local_41);
    AddError(this,element_name,&descriptor->super_Message,NAME,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
LAB_002c917b:
  for (local_58 = 0; iVar3 = ServiceDescriptor::method_count((ServiceDescriptor *)proto_local),
      local_58 < iVar3; local_58 = local_58 + 1) {
    lVar1 = *(long *)&(proto_local->method_).super_RepeatedPtrFieldBase.total_size_;
    proto_00 = ServiceDescriptorProto::method(local_20,local_58);
    ValidateMethodOptions(this,(MethodDescriptor *)(lVar1 + (long)local_58 * 0x30),proto_00);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateServiceOptions(ServiceDescriptor* service,
    const ServiceDescriptorProto& proto) {
  if (IsLite(service->file()) &&
      (service->file()->options().cc_generic_services() ||
       service->file()->options().java_generic_services())) {
    AddError(service->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Files with optimize_for = LITE_RUNTIME cannot define services "
             "unless you set both options cc_generic_services and "
             "java_generic_sevices to false.");
  }

  VALIDATE_OPTIONS_FROM_ARRAY(service, method, Method);
}